

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O0

void __thiscall Unit::Unit(Unit *this,Unit *u)

{
  int local_1c;
  int i;
  Unit *u_local;
  Unit *this_local;
  
  std::__cxx11::string::string((string *)&this->sUnitName);
  std::__cxx11::string::string((string *)&this->sUnitSymbol);
  this->nExpPrefix = u->nExpPrefix;
  for (local_1c = 0; local_1c < 7; local_1c = local_1c + 1) {
    this->siUnits[local_1c] = u->siUnits[local_1c];
  }
  this->bInvalid = (bool)(u->bInvalid & 1);
  setNames(this);
  return;
}

Assistant:

Unit::Unit( const Unit& u )
{
	nExpPrefix = u.nExpPrefix;
	for( int i=0; i<7; i++ )
		siUnits[i] = u.siUnits[i];
	bInvalid = u.bInvalid;
	setNames();
}